

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highlighting.cpp
# Opt level: O0

vector<duckdb::highlightToken,_true> *
duckdb::Highlighting::Tokenize(char *buf,size_t len,bool is_dot_command,searchMatch *match)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  iterator this;
  __normal_iterator<duckdb::highlightToken_*,_std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>_>
  __position;
  byte in_CL;
  vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *in_RDI;
  long in_R8;
  bool bVar4;
  highlightToken end_token;
  highlightToken search_token;
  tokenType end_type;
  size_t token_position;
  size_t i;
  vector<duckdb::highlightToken,_true> *tokens;
  vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *in_stack_fffffffffffffe68
  ;
  vector<duckdb::highlightToken,_true> *in_stack_fffffffffffffe70;
  highlightToken *this_00;
  __normal_iterator<duckdb::highlightToken_*,_std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>_>
  *in_stack_fffffffffffffe78;
  size_t in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  value_type *in_stack_ffffffffffffff08;
  vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *in_stack_ffffffffffffff10
  ;
  const_iterator in_stack_ffffffffffffff18;
  highlightToken local_d8;
  highlightToken *local_c0;
  highlightToken *local_b8;
  highlightToken *local_b0;
  highlightToken local_a0;
  tokenType local_81;
  ulong local_80;
  long local_78;
  size_t in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  
  vector<duckdb::highlightToken,_true>::vector((vector<duckdb::highlightToken,_true> *)0x1f3f62);
  if ((in_CL & 1) == 0) {
    GetParseTokens(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    vector<duckdb::highlightToken,_true>::operator=
              (in_stack_fffffffffffffe70,
               (vector<duckdb::highlightToken,_true> *)in_stack_fffffffffffffe68);
    vector<duckdb::highlightToken,_true>::~vector((vector<duckdb::highlightToken,_true> *)0x1f3fad);
  }
  else {
    GetDotCommandTokens(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    vector<duckdb::highlightToken,_true>::operator=
              (in_stack_fffffffffffffe70,
               (vector<duckdb::highlightToken,_true> *)in_stack_fffffffffffffe68);
    vector<duckdb::highlightToken,_true>::~vector((vector<duckdb::highlightToken,_true> *)0x1f4016);
  }
  if (in_R8 != 0) {
    for (local_78 = 0; uVar1 = local_78 + 1,
        sVar2 = ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::size
                          (in_RDI), uVar1 < sVar2; local_78 = local_78 + 1) {
      pvVar3 = vector<duckdb::highlightToken,_true>::operator[]
                         (in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68);
      if ((pvVar3->start <= *(ulong *)(in_R8 + 8)) &&
         (pvVar3 = vector<duckdb::highlightToken,_true>::operator[]
                             (in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68),
         *(ulong *)(in_R8 + 8) <= pvVar3->start)) {
        local_80 = local_78 + 1;
        pvVar3 = vector<duckdb::highlightToken,_true>::operator[]
                           (in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68);
        local_81 = pvVar3->type;
        pvVar3 = vector<duckdb::highlightToken,_true>::operator[]
                           (in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68);
        if (pvVar3->start == *(size_t *)(in_R8 + 8)) {
          pvVar3 = vector<duckdb::highlightToken,_true>::operator[]
                             (in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68);
          pvVar3->search_match = true;
        }
        else {
          highlightToken::highlightToken(&local_a0);
          pvVar3 = vector<duckdb::highlightToken,_true>::operator[]
                             (in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68);
          local_a0.type = pvVar3->type;
          local_a0.start = *(size_t *)(in_R8 + 8);
          local_a0.search_match = true;
          local_b8 = (highlightToken *)
                     ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                     ::begin(in_stack_fffffffffffffe68);
          local_b0 = (highlightToken *)
                     __gnu_cxx::
                     __normal_iterator<duckdb::highlightToken_*,_std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>_>
                     ::operator+(in_stack_fffffffffffffe78,
                                 (difference_type)in_stack_fffffffffffffe70);
          __gnu_cxx::
          __normal_iterator<duckdb::highlightToken_const*,std::vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>>>
          ::__normal_iterator<duckdb::highlightToken*>
                    ((__normal_iterator<const_duckdb::highlightToken_*,_std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>_>
                      *)in_stack_fffffffffffffe70,
                     (__normal_iterator<duckdb::highlightToken_*,_std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>_>
                      *)in_stack_fffffffffffffe68);
          local_c0 = (highlightToken *)
                     ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                     ::insert(in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,
                              in_stack_ffffffffffffff08);
          local_80 = local_80 + 1;
        }
        while( true ) {
          uVar1 = local_80;
          sVar2 = ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::
                  size(in_RDI);
          bVar4 = false;
          if (uVar1 < sVar2) {
            pvVar3 = vector<duckdb::highlightToken,_true>::operator[]
                               (in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68);
            bVar4 = pvVar3->start < *(ulong *)(in_R8 + 0x10);
          }
          uVar1 = local_80;
          if (!bVar4) break;
          pvVar3 = vector<duckdb::highlightToken,_true>::operator[]
                             (in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68);
          local_81 = pvVar3->type;
          pvVar3 = vector<duckdb::highlightToken,_true>::operator[]
                             (in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68);
          pvVar3->search_match = true;
          local_80 = local_80 + 1;
        }
        sVar2 = ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::size
                          (in_RDI);
        if ((uVar1 < sVar2) &&
           (pvVar3 = vector<duckdb::highlightToken,_true>::operator[]
                               (in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68),
           pvVar3->start <= *(ulong *)(in_R8 + 0x10))) {
          return (vector<duckdb::highlightToken,_true> *)in_RDI;
        }
        this_00 = &local_d8;
        highlightToken::highlightToken(this_00);
        local_d8.type = local_81;
        local_d8.start = *(size_t *)(in_R8 + 0x10);
        this = ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::begin
                         (in_stack_fffffffffffffe68);
        __position = __gnu_cxx::
                     __normal_iterator<duckdb::highlightToken_*,_std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>_>
                     ::operator+(in_stack_fffffffffffffe78,this_00);
        __gnu_cxx::
        __normal_iterator<duckdb::highlightToken_const*,std::vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>>>
        ::__normal_iterator<duckdb::highlightToken*>
                  ((__normal_iterator<const_duckdb::highlightToken_*,_std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>_>
                    *)this_00,
                   (__normal_iterator<duckdb::highlightToken_*,_std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>_>
                    *)in_stack_fffffffffffffe68);
        ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::insert
                  ((vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *)
                   this._M_current,(const_iterator)__position._M_current,in_stack_ffffffffffffff08);
        return (vector<duckdb::highlightToken,_true> *)in_RDI;
      }
    }
  }
  return (vector<duckdb::highlightToken,_true> *)in_RDI;
}

Assistant:

vector<highlightToken> Highlighting::Tokenize(char *buf, size_t len, bool is_dot_command, searchMatch *match) {
	vector<highlightToken> tokens;
	if (!is_dot_command) {
		// SQL query - use parser to obtain tokens
		tokens = GetParseTokens(buf, len);
	} else {
		// . command
		tokens = GetDotCommandTokens(buf, len);
	}
	if (match) {
		// we have a search match - insert it into the token list
		// we want to insert a search token with start = match_start, end = match_end
		// first figure out which token type we would have at match_end (if any)
		for (size_t i = 0; i + 1 < tokens.size(); i++) {
			if (tokens[i].start <= match->match_start && tokens[i + 1].start >= match->match_start) {
				// this token begins after the search position, insert the token here
				size_t token_position = i + 1;
				auto end_type = tokens[i].type;
				if (tokens[i].start == match->match_start) {
					// exact start: only set the search match
					tokens[i].search_match = true;
				} else {
					// non-exact start: add a new token
					highlightToken search_token;
					search_token.type = tokens[i].type;
					search_token.start = match->match_start;
					search_token.search_match = true;
					tokens.insert(tokens.begin() + token_position, search_token);
					token_position++;
				}

				// move forwards
				while (token_position < tokens.size() && tokens[token_position].start < match->match_end) {
					// this token is
					// mark this token as a search token
					end_type = tokens[token_position].type;
					tokens[token_position].search_match = true;
					token_position++;
				}
				if (token_position >= tokens.size() || tokens[token_position].start > match->match_end) {
					// insert the token that marks the end of the search
					highlightToken end_token;
					end_token.type = end_type;
					end_token.start = match->match_end;
					tokens.insert(tokens.begin() + token_position, end_token);
					token_position++;
				}
				break;
			}
		}
	}
	return tokens;
}